

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

void ray_intersect_triangles_all
               (vec3 ro,vec3 rd,vec3 *points,int num_points,mat4 transform,float *t)

{
  float fVar1;
  vec3 b;
  vec3 v;
  _Bool _Var2;
  vec3 vVar3;
  vec3 vVar4;
  vec3 vVar5;
  float local_124;
  undefined8 uStack_120;
  float t0;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  vec3 local_f0;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  vec3 local_c0;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  vec3 tp2;
  undefined4 uStack_7c;
  vec3 tp1;
  vec3 tp0;
  int i;
  float *t_local;
  int num_points_local;
  vec3 *points_local;
  vec3 rd_local;
  vec3 ro_local;
  
  for (tp0.y = 0.0; (int)tp0.y < num_points; tp0.y = (float)((int)tp0.y + 3)) {
    local_a8 = points[(int)tp0.y].z;
    local_b0._0_4_ = points[(int)tp0.y].x;
    local_b0._4_4_ = points[(int)tp0.y].y;
    fVar1 = points[(int)tp0.y + 1].z;
    tp2.z = points[(int)tp0.y + 1].x;
    uStack_7c = points[(int)tp0.y + 1].y;
    tp2.x = points[(int)tp0.y + 2].z;
    local_90._0_4_ = points[(int)tp0.y + 2].x;
    local_90._4_4_ = points[(int)tp0.y + 2].y;
    vVar3.z = local_a8;
    vVar3.x = (float)(undefined4)local_b0;
    vVar3.y = (float)local_b0._4_4_;
    vVar3 = vec3_apply_mat4(vVar3,1.0,transform);
    local_c0.z = vVar3.z;
    local_98 = local_c0.z;
    local_c0._0_8_ = vVar3._0_8_;
    local_a0._0_4_ = local_c0.x;
    local_a0._4_4_ = local_c0.y;
    local_e0 = stack0xffffffffffffff80;
    v.z = fVar1;
    v.x = tp2.z;
    v.y = (float)uStack_7c;
    local_d8 = fVar1;
    local_c0 = vVar3;
    vVar4 = vec3_apply_mat4(v,1.0,transform);
    local_f0.z = vVar4.z;
    fVar1 = local_f0.z;
    local_c8 = local_f0.z;
    local_f0._0_8_ = vVar4._0_8_;
    local_d0._0_4_ = local_f0.x;
    local_d0._4_4_ = local_f0.y;
    tp2.z = local_f0.x;
    uStack_7c = local_f0.y;
    local_108 = tp2.x;
    local_110 = local_90;
    vVar5.z = tp2.x;
    vVar5.x = (float)(undefined4)local_90;
    vVar5.y = (float)local_90._4_4_;
    local_f0 = vVar4;
    _uStack_120 = vec3_apply_mat4(vVar5,1.0,transform);
    local_f8 = local_118;
    local_100 = uStack_120;
    tp2.x = local_118;
    local_90 = uStack_120;
    local_124 = 3.4028235e+38;
    vVar5 = vec3_add(ro,rd);
    b.z = fVar1;
    b.x = tp2.z;
    b.y = (float)uStack_7c;
    vVar4.z = tp2.x;
    vVar4.x = (float)(undefined4)local_90;
    vVar4.y = (float)local_90._4_4_;
    _Var2 = intersect_segment_triangle(ro,vVar5,vVar3,b,vVar4,&local_124);
    if (_Var2) {
      t[(int)tp0.y / 3] = local_124;
    }
    else {
      t[(int)tp0.y / 3] = 3.4028235e+38;
    }
  }
  return;
}

Assistant:

void ray_intersect_triangles_all(vec3 ro, vec3 rd, vec3 *points, int num_points, mat4 transform, float *t) { 
    for (int i = 0; i < num_points; i += 3) {
        vec3 tp0 = points[i + 0];
        vec3 tp1 = points[i + 1];
        vec3 tp2 = points[i + 2];
        tp0 = vec3_apply_mat4(tp0, 1.0f, transform);
        tp1 = vec3_apply_mat4(tp1, 1.0f, transform);
        tp2 = vec3_apply_mat4(tp2, 1.0f, transform);

        float t0 = FLT_MAX;
        if (intersect_segment_triangle(ro, vec3_add(ro, rd), tp0, tp1, tp2, &t0)) {
            t[i/3] = t0;    
        }
        else {
            t[i/3] = FLT_MAX;
        }
    }
}